

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

void __thiscall
testing::internal::StreamingListener::SocketWriter::Send(SocketWriter *this,string *message)

{
  int __fd;
  bool bVar1;
  ostream *poVar2;
  void *__buf;
  ssize_t sVar3;
  long in_RDI;
  char *unaff_retaddr;
  GTestLogSeverity in_stack_0000000c;
  GTestLog *in_stack_00000010;
  int len;
  GTestLog *in_stack_ffffffffffffff90;
  GTestLog local_2c;
  int local_28;
  GTestLog local_14 [4];
  int line;
  
  unique0x100001d2 = in_RDI;
  bVar1 = IsTrue(*(int *)(in_RDI + 8) != -1);
  line = (int)((ulong)stack0xfffffffffffffff8 >> 0x20);
  if (!bVar1) {
    GTestLog::GTestLog(in_stack_00000010,in_stack_0000000c,unaff_retaddr,line);
    poVar2 = GTestLog::GetStream(local_14);
    poVar2 = std::operator<<(poVar2,"Condition sockfd_ != -1 failed. ");
    std::operator<<(poVar2,"Send() can be called only when there is a connection.");
    GTestLog::~GTestLog(in_stack_ffffffffffffff90);
  }
  local_28 = std::__cxx11::string::length();
  __fd = *(int *)(in_RDI + 8);
  __buf = (void *)std::__cxx11::string::c_str();
  sVar3 = write(__fd,__buf,(long)local_28);
  if (sVar3 != local_28) {
    GTestLog::GTestLog(in_stack_00000010,in_stack_0000000c,unaff_retaddr,line);
    poVar2 = GTestLog::GetStream(&local_2c);
    poVar2 = std::operator<<(poVar2,"stream_result_to: failed to stream to ");
    poVar2 = std::operator<<(poVar2,(string *)(in_RDI + 0x10));
    poVar2 = std::operator<<(poVar2,":");
    std::operator<<(poVar2,(string *)(in_RDI + 0x30));
    GTestLog::~GTestLog((GTestLog *)poVar2);
  }
  return;
}

Assistant:

virtual void Send(const string& message) {
      GTEST_CHECK_(sockfd_ != -1)
          << "Send() can be called only when there is a connection.";

      const int len = static_cast<int>(message.length());
      if (write(sockfd_, message.c_str(), len) != len) {
        GTEST_LOG_(WARNING)
            << "stream_result_to: failed to stream to "
            << host_name_ << ":" << port_num_;
      }
    }